

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcDerivedProfileDef::IfcDerivedProfileDef(IfcDerivedProfileDef *this)

{
  *(undefined8 *)&this->field_0xa8 = 0;
  *(char **)&this->field_0xb0 = "IfcDerivedProfileDef";
  (this->super_IfcProfileDef).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>.
  aux_is_derived.super__Base_bitset<1UL>._M_w = 0;
  *(undefined1 **)
   &(this->super_IfcProfileDef).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>.
    field_0x10 = &(this->super_IfcProfileDef).
                  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>.field_0x20;
  *(undefined8 *)
   &(this->super_IfcProfileDef).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>.
    field_0x18 = 0;
  (this->super_IfcProfileDef).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>.
  field_0x20 = 0;
  (this->super_IfcProfileDef).ProfileName.ptr._M_dataplus._M_p =
       (pointer)&(this->super_IfcProfileDef).ProfileName.ptr.field_2;
  (this->super_IfcProfileDef).ProfileName.ptr._M_string_length = 0;
  (this->super_IfcProfileDef).ProfileName.ptr.field_2._M_local_buf[0] = '\0';
  (this->super_IfcProfileDef).ProfileName.have = false;
  *(undefined8 *)&(this->super_IfcProfileDef).field_0x60 = 0;
  (this->super_IfcProfileDef).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>.
  _vptr_ObjectHelper = (_func_int **)0x8ce970;
  *(undefined8 *)&this->field_0xa0 = 0x8ce9c0;
  *(undefined8 *)&(this->super_IfcProfileDef).field_0x58 = 0x8ce998;
  *(undefined8 *)&(this->super_IfcProfileDef).field_0x68 = 0;
  (this->Operator).obj = (LazyObject *)0x0;
  (this->Label).ptr._M_dataplus._M_p = (pointer)&(this->Label).ptr.field_2;
  (this->Label).ptr._M_string_length = 0;
  (this->Label).ptr.field_2._M_local_buf[0] = '\0';
  (this->Label).have = false;
  return;
}

Assistant:

IfcDerivedProfileDef() : Object("IfcDerivedProfileDef") {}